

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O1

RABlock * __thiscall
asmjit::BaseRAPass::_nearestCommonDominator(BaseRAPass *this,RABlock *a,RABlock *b)

{
  bool bVar1;
  uint64_t uVar2;
  RABlock *pRVar3;
  RABlock *pRVar4;
  
  if (a == (RABlock *)0x0) {
    _nearestCommonDominator();
    pRVar4 = a;
LAB_00121a29:
    _nearestCommonDominator();
  }
  else {
    pRVar4 = a;
    if (b == (RABlock *)0x0) goto LAB_00121a29;
    if (a != b) {
      bVar1 = _strictlyDominates(this,a,b);
      pRVar3 = a;
      if ((bVar1) || (pRVar4 = b, bVar1 = _strictlyDominates(this,b,a), pRVar3 = b, bVar1)) {
        return pRVar3;
      }
      if ((this->_blocks).super_ZoneVectorBase._size != 0) {
        pRVar4 = *(this->_blocks).super_ZoneVectorBase._data;
        uVar2 = this->_lastTimestamp + 1;
        this->_lastTimestamp = uVar2;
        for (pRVar3 = a->_idom; pRVar3 != pRVar4; pRVar3 = pRVar3->_idom) {
          pRVar3->_timestamp = uVar2;
        }
        do {
          b = b->_idom;
          if (b == pRVar4) {
            return pRVar4;
          }
        } while (b->_timestamp != uVar2);
        return b;
      }
      goto LAB_00121a33;
    }
  }
  _nearestCommonDominator();
LAB_00121a33:
  _nearestCommonDominator();
  for (; (pRVar4 != (RABlock *)0x0 && (((ulong)pRVar4->_first & 0x1400) != 0));
      pRVar4 = *(RABlock **)&pRVar4->_blockId) {
  }
  return pRVar4;
}

Assistant:

const RABlock* BaseRAPass::_nearestCommonDominator(const RABlock* a, const RABlock* b) const noexcept {
  ASMJIT_ASSERT(a != nullptr); // There must be at least one block if this function is
  ASMJIT_ASSERT(b != nullptr); // called, as both `a` and `b` must be valid blocks.
  ASMJIT_ASSERT(a != b);       // Checked by `dominates()` and `properlyDominates()`.

  if (a == b)
    return a;

  // If `a` strictly dominates `b` then `a` is the nearest common dominator.
  if (_strictlyDominates(a, b))
    return a;

  // If `b` strictly dominates `a` then `b` is the nearest common dominator.
  if (_strictlyDominates(b, a))
    return b;

  const RABlock* entryBlock = this->entryBlock();
  uint64_t timestamp = nextTimestamp();

  // Mark all A's dominators.
  const RABlock* block = a->iDom();
  while (block != entryBlock) {
    block->setTimestamp(timestamp);
    block = block->iDom();
  }

  // Check all B's dominators against marked dominators of A.
  block = b->iDom();
  while (block != entryBlock) {
    if (block->hasTimestamp(timestamp))
      return block;
    block = block->iDom();
  }

  return entryBlock;
}